

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_comments_abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          preserve_comments *comments,indent_char indent_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pbVar4;
  string_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  serializer<toml::type_config> *local_38;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar4 = (comments->comments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (comments->comments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar2) {
    paVar1 = &local_a0.field_2;
    local_38 = this;
    do {
      if (pbVar4->_M_string_length != 0) {
        format_indent_abi_cxx11_(&local_a0,local_38,indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (*(pbVar4->_M_dataplus)._M_p != '#') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,'#');
        }
        pcVar3 = (pbVar4->_M_dataplus)._M_p;
        local_80 = &local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar3,pcVar3 + pbVar4->_M_string_length);
        local_50 = local_78;
        if (local_80 == &local_70) {
          local_a0.field_2._8_8_ = local_70._8_8_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a0._M_dataplus._M_p = (pointer)local_80;
        }
        local_a0.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
        local_a0.field_2._M_local_buf[0] = local_70._M_local_buf[0];
        local_a0._M_string_length = local_78;
        local_78 = 0;
        local_70._M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p == paVar1) {
          local_48._8_8_ = local_a0.field_2._8_8_;
          local_58 = &local_48;
        }
        else {
          local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_a0._M_dataplus._M_p;
        }
        local_48._M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
        local_80 = &local_70;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,local_58->_M_local_buf,local_50);
        if (local_58 != &local_48) {
          operator_delete(local_58,local_48._M_allocated_capacity + 1);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,CONCAT71(local_70._M_allocated_capacity._1_7_,
                                            local_70._M_local_buf[0]) + 1);
        }
        if ((pbVar4->_M_dataplus)._M_p[pbVar4->_M_string_length - 1] != '\n') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,'\n');
        }
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type format_comments(const preserve_comments& comments, const indent_char indent_type) const // {{{
    {
        string_type retval;
        for(const auto& c : comments)
        {
            if(c.empty()) {continue;}
            retval += format_indent(indent_type);
            if(c.front() != '#') {retval += char_type('#');}
            retval += string_conv<string_type>(c);
            if(c.back() != '\n') {retval += char_type('\n');}
        }
        return retval;
    }